

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O1

wchar_t archive_entry_sparse_next(archive_entry *entry,int64_t *offset,int64_t *length)

{
  ae_sparse *paVar1;
  
  paVar1 = entry->sparse_p;
  if (paVar1 != (ae_sparse *)0x0) {
    *offset = paVar1->offset;
    *length = paVar1->length;
    entry->sparse_p = paVar1->next;
    return L'\0';
  }
  *offset = 0;
  *length = 0;
  return L'\xffffffec';
}

Assistant:

int
archive_entry_sparse_next(struct archive_entry * entry,
	int64_t *offset, int64_t *length)
{
	if (entry->sparse_p) {
		*offset = entry->sparse_p->offset;
		*length = entry->sparse_p->length;

		entry->sparse_p = entry->sparse_p->next;

		return (ARCHIVE_OK);
	} else {
		*offset = 0;
		*length = 0;
		return (ARCHIVE_WARN);
	}
}